

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tweakable.cpp
# Opt level: O3

string * Corrade::Utility::Implementation::findTweakableAlias
                   (string *__return_storage_ptr__,string *data)

{
  char cVar1;
  byte bVar2;
  pointer pcVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  pointer pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  StringView prefix;
  BasicStringView<const_char> local_60;
  char local_50 [16];
  StringView local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"CORRADE_TWEAKABLE","");
  lVar6 = std::__cxx11::string::find((char *)data,0x16467d,0);
joined_r0x00152d09:
  if (lVar6 == -1) {
    return __return_storage_ptr__;
  }
  pcVar3 = (data->_M_dataplus)._M_p;
  for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
    cVar1 = pcVar3[lVar7 + -1];
    if ((cVar1 != ' ') && (cVar1 != '\t')) {
      uVar9 = lVar6 + 7;
      if (cVar1 != '\n') goto LAB_00152e79;
      break;
    }
  }
  uVar10 = lVar6 + 7;
  uVar4 = data->_M_string_length;
  uVar11 = uVar10;
  uVar9 = uVar10;
  if (uVar10 < uVar4) {
    do {
      if ((pcVar3[uVar9] != ' ') && (uVar11 = uVar9, pcVar3[uVar9] != '\t')) break;
      uVar9 = uVar9 + 1;
      uVar11 = uVar4;
    } while (uVar4 != uVar9);
  }
  lVar6 = 0;
  pcVar8 = pcVar3;
  do {
    bVar2 = pcVar8[uVar11];
    if ((char)bVar2 < 'A') {
      if ((((char)bVar2 < '0') || (uVar11 - uVar10 == lVar6)) || (0x39 < bVar2)) break;
    }
    else if (0x5a < bVar2) {
      if (bVar2 < 0x61) {
        if (bVar2 != 0x5f) break;
      }
      else if (0x7a < bVar2) break;
    }
    lVar6 = lVar6 + -1;
    pcVar8 = pcVar8 + 1;
  } while( true );
  uVar11 = uVar11 - lVar6;
  uVar9 = uVar11;
  for (; (uVar11 < uVar4 && ((pcVar3[uVar11] == ' ' || (uVar9 = uVar11, pcVar3[uVar11] == '\t'))));
      uVar11 = uVar11 + 1) {
    uVar9 = uVar4;
  }
  local_40 = Containers::Implementation::
             StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::from(data);
  local_60 = Containers::BasicStringView<const_char>::slice
                       (&local_40,uVar9,local_40._sizePlusFlags & 0x3fffffffffffffff);
  prefix._sizePlusFlags = 0xc000000000000011;
  prefix._data = "CORRADE_TWEAKABLE";
  bVar5 = Containers::BasicStringView<const_char>::hasPrefix(&local_60,prefix);
  if (bVar5) {
    uVar9 = uVar9 + __return_storage_ptr__->_M_string_length;
    uVar4 = data->_M_string_length;
    if (uVar9 < uVar4) {
      while ((cVar1 = (data->_M_dataplus)._M_p[uVar9], cVar1 == ' ' || (cVar1 == '\t'))) {
        uVar9 = uVar9 + 1;
        if (uVar4 <= uVar9) goto LAB_00152e9f;
      }
    }
    if (((uVar4 <= uVar9) || (cVar1 = (data->_M_dataplus)._M_p[uVar9], cVar1 == '\r')) ||
       (cVar1 == '\n')) {
LAB_00152e9f:
      std::__cxx11::string::substr((ulong)&local_60,(ulong)data);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
      if (local_60._data == local_50) {
        return __return_storage_ptr__;
      }
      operator_delete(local_60._data);
      return __return_storage_ptr__;
    }
  }
LAB_00152e79:
  lVar6 = std::__cxx11::string::find((char *)data,0x16467d,uVar9);
  goto joined_r0x00152d09;
}

Assistant:

std::string findTweakableAlias(const std::string& data) {
    using namespace Containers::Literals;

    std::string name = "CORRADE_TWEAKABLE";
    std::size_t pos = 0;
    while((pos = data.find("#define", pos)) != std::string::npos) {
        /* Eat all whitespace before */
        std::size_t prev = pos;
        while(prev && (data[prev - 1] == ' ' || data[prev - 1] == '\t'))
            --prev;

        /* Skip what we found, so `continue`s will not cause an infinite loop */
        pos += 7;

        /* If this is not at the start of a line (or first in the file), nope */
        if(prev && data[prev - 1] != '\n')
            continue;

        /* Get rid of whitespace */
        std::size_t beg = pos;
        eatWhitespace(data, beg);

        /* Consume the name */
        std::size_t end = beg;
        while((data[end] >= 'A' && data[end] <= 'Z') ||
              (data[end] >= 'a' && data[end] <= 'z') ||
              (data[end] >= '0' && data[end] <= '9' && end != pos) ||
              (data[end] == '_')) ++end;

        /* Get rid of whitespace after */
        pos = end;
        eatWhitespace(data, pos);

        /* If the rest doesn't read CORRADE_TWEAKABLE, nope */
        /** @todo convert all this to operate on StringViews when we have
            find() as well */
        if(!Containers::StringView{data}.exceptPrefix(pos).hasPrefix("CORRADE_TWEAKABLE"_s))
            continue;

        /* Get rid of whitespace at the end of the line */
        pos += name.size();
        eatWhitespace(data, pos);

        /* If there is something else than a newline or EOF, nope */
        if(pos < data.size() && data[pos] != '\r' && data[pos] != '\n')
            continue;

        /* Save the name */
        name = data.substr(beg, end - beg);
        break;
    }

    return name;
}